

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3AtoF(char *z,double *pResult,int length,u8 enc)

{
  bool bVar1;
  float fVar2;
  bool bVar3;
  bool bVar4;
  bool local_f9;
  long local_f8;
  double local_e0;
  int local_d4;
  longdouble scale;
  int local_6c;
  int i;
  int nonNum;
  int nDigits;
  double result;
  int eValid;
  int e;
  int esign;
  int d;
  i64 s;
  double *pdStack_38;
  int sign;
  char *zEnd;
  int incr;
  u8 enc_local;
  int length_local;
  double *pResult_local;
  char *z_local;
  
  pdStack_38 = (double *)(z + length);
  s._4_4_ = 1;
  _esign = 0;
  e = 0;
  eValid = 1;
  result._4_4_ = 0;
  bVar1 = true;
  i = 0;
  bVar3 = false;
  *pResult = 0.0;
  if (enc == '\x01') {
    zEnd._4_4_ = 1;
    pResult_local = (double *)z;
  }
  else {
    zEnd._4_4_ = 2;
    local_6c = 3 - (uint)enc;
    while( true ) {
      bVar3 = false;
      if (local_6c < length) {
        bVar3 = z[local_6c] == '\0';
      }
      if (!bVar3) break;
      local_6c = local_6c + 2;
    }
    bVar3 = local_6c < length;
    pdStack_38 = (double *)(z + (long)(int)(uint)enc + (long)local_6c + -3);
    pResult_local = (double *)(z + (int)(enc & 1));
  }
  while( true ) {
    bVar4 = false;
    if (pResult_local < pdStack_38) {
      bVar4 = (""[*(byte *)pResult_local] & 1) != 0;
    }
    if (!bVar4) break;
    pResult_local = (double *)((long)pResult_local + (long)zEnd._4_4_);
  }
  if (pdStack_38 <= pResult_local) {
    return 0;
  }
  if (*(char *)pResult_local == '-') {
    s._4_4_ = -1;
    pResult_local = (double *)((long)pResult_local + (long)zEnd._4_4_);
  }
  else if (*(char *)pResult_local == '+') {
    pResult_local = (double *)((long)pResult_local + (long)zEnd._4_4_);
  }
  while( true ) {
    bVar4 = false;
    if (pResult_local < pdStack_38) {
      bVar4 = *(char *)pResult_local == '0';
    }
    if (!bVar4) break;
    pResult_local = (double *)((long)pResult_local + (long)zEnd._4_4_);
    i = i + 1;
  }
  while( true ) {
    bVar4 = false;
    if ((pResult_local < pdStack_38) && (bVar4 = false, (""[*(byte *)pResult_local] & 4) != 0)) {
      bVar4 = _esign < 0xccccccccccccccb;
    }
    if (!bVar4) break;
    _esign = _esign * 10 + (long)(*(char *)pResult_local + -0x30);
    pResult_local = (double *)((long)pResult_local + (long)zEnd._4_4_);
    i = i + 1;
  }
  while( true ) {
    bVar4 = false;
    if (pResult_local < pdStack_38) {
      bVar4 = (""[*(byte *)pResult_local] & 4) != 0;
    }
    if (!bVar4) break;
    pResult_local = (double *)((long)pResult_local + (long)zEnd._4_4_);
    i = i + 1;
    e = e + 1;
  }
  if (pResult_local < pdStack_38) {
    if (*(char *)pResult_local == '.') {
      pResult_local = (double *)((long)pResult_local + (long)zEnd._4_4_);
      while( true ) {
        bVar4 = false;
        if ((pResult_local < pdStack_38) && (bVar4 = false, (""[*(byte *)pResult_local] & 4) != 0))
        {
          bVar4 = _esign < 0xccccccccccccccb;
        }
        if (!bVar4) break;
        _esign = _esign * 10 + (long)(*(char *)pResult_local + -0x30);
        pResult_local = (double *)((long)pResult_local + (long)zEnd._4_4_);
        i = i + 1;
        e = e + -1;
      }
      while( true ) {
        bVar4 = false;
        if (pResult_local < pdStack_38) {
          bVar4 = (""[*(byte *)pResult_local] & 4) != 0;
        }
        if (!bVar4) break;
        pResult_local = (double *)((long)pResult_local + (long)zEnd._4_4_);
        i = i + 1;
      }
    }
    if (pResult_local < pdStack_38) {
      if ((*(char *)pResult_local == 'e') || (*(char *)pResult_local == 'E')) {
        pResult_local = (double *)((long)pResult_local + (long)zEnd._4_4_);
        bVar1 = false;
        if (pdStack_38 <= pResult_local) goto LAB_001966a8;
        if (*(char *)pResult_local == '-') {
          eValid = -1;
          pResult_local = (double *)((long)pResult_local + (long)zEnd._4_4_);
        }
        else if (*(char *)pResult_local == '+') {
          pResult_local = (double *)((long)pResult_local + (long)zEnd._4_4_);
        }
        while( true ) {
          bVar4 = false;
          if (pResult_local < pdStack_38) {
            bVar4 = (""[*(byte *)pResult_local] & 4) != 0;
          }
          if (!bVar4) break;
          if (result._4_4_ < 10000) {
            local_d4 = result._4_4_ * 10 + *(char *)pResult_local + -0x30;
          }
          else {
            local_d4 = 10000;
          }
          result._4_4_ = local_d4;
          pResult_local = (double *)((long)pResult_local + (long)zEnd._4_4_);
          bVar1 = true;
        }
      }
      if ((i != 0) && (bVar1)) {
        while( true ) {
          bVar4 = false;
          if (pResult_local < pdStack_38) {
            bVar4 = (""[*(byte *)pResult_local] & 1) != 0;
          }
          if (!bVar4) break;
          pResult_local = (double *)((long)pResult_local + (long)zEnd._4_4_);
        }
      }
    }
  }
LAB_001966a8:
  result._4_4_ = result._4_4_ * eValid + e;
  if (result._4_4_ < 0) {
    eValid = -1;
    result._4_4_ = -result._4_4_;
  }
  else {
    eValid = 1;
  }
  if (_esign == 0) {
    local_e0 = -0.0;
    if (-1 < s._4_4_ || i == 0) {
      local_e0 = 0.0;
    }
    _nonNum = local_e0;
  }
  else {
    if (eValid < 1) {
      for (; _esign % 10 == 0 && 0 < result._4_4_; _esign = _esign / 10) {
        result._4_4_ = result._4_4_ + -1;
      }
    }
    else {
      for (; _esign < 0xccccccccccccccc && 0 < result._4_4_; _esign = _esign * 10) {
        result._4_4_ = result._4_4_ + -1;
      }
    }
    if (s._4_4_ < 0) {
      local_f8 = -_esign;
    }
    else {
      local_f8 = _esign;
    }
    if (result._4_4_ == 0) {
      _nonNum = (double)local_f8;
    }
    else {
      fVar2 = 1.0;
      if ((result._4_4_ < 0x134) || (0x155 < result._4_4_)) {
        if (result._4_4_ < 0x156) {
          for (; result._4_4_ % 0x16 != 0; result._4_4_ = result._4_4_ + -1) {
            fVar2 = fVar2 * 10.0;
          }
          for (; 0 < result._4_4_; result._4_4_ = result._4_4_ + -0x16) {
            fVar2 = fVar2 * 1e+22;
          }
          if (eValid < 0) {
            fVar2 = (float)local_f8 / fVar2;
          }
          else {
            fVar2 = fVar2 * (float)local_f8;
          }
          _nonNum = (double)fVar2;
        }
        else if (eValid < 0) {
          _nonNum = (double)local_f8 * 0.0;
        }
        else {
          _nonNum = (double)local_f8 * INFINITY;
        }
      }
      else {
        for (; result._4_4_ % 0x134 != 0; result._4_4_ = result._4_4_ + -1) {
          fVar2 = fVar2 * 10.0;
        }
        if (eValid < 0) {
          _nonNum = (double)((float)local_f8 / fVar2) / 1e+308;
        }
        else {
          _nonNum = (double)(fVar2 * (float)local_f8) * 1e+308;
        }
      }
    }
  }
  *pResult = _nonNum;
  local_f9 = false;
  if (((pdStack_38 <= pResult_local) && (local_f9 = false, 0 < i)) && (local_f9 = false, bVar1)) {
    local_f9 = !bVar3;
  }
  return (uint)local_f9;
}

Assistant:

SQLITE_PRIVATE int sqlite3AtoF(const char *z, double *pResult, int length, u8 enc){
#ifndef SQLITE_OMIT_FLOATING_POINT
  int incr;
  const char *zEnd = z + length;
  /* sign * significand * (10 ^ (esign * exponent)) */
  int sign = 1;    /* sign of significand */
  i64 s = 0;       /* significand */
  int d = 0;       /* adjust exponent for shifting decimal point */
  int esign = 1;   /* sign of exponent */
  int e = 0;       /* exponent */
  int eValid = 1;  /* True exponent is either not used or is well-formed */
  double result;
  int nDigits = 0;
  int nonNum = 0;

  assert( enc==SQLITE_UTF8 || enc==SQLITE_UTF16LE || enc==SQLITE_UTF16BE );
  *pResult = 0.0;   /* Default return value, in case of an error */

  if( enc==SQLITE_UTF8 ){
    incr = 1;
  }else{
    int i;
    incr = 2;
    assert( SQLITE_UTF16LE==2 && SQLITE_UTF16BE==3 );
    for(i=3-enc; i<length && z[i]==0; i+=2){}
    nonNum = i<length;
    zEnd = z+i+enc-3;
    z += (enc&1);
  }

  /* skip leading spaces */
  while( z<zEnd && sqlite3Isspace(*z) ) z+=incr;
  if( z>=zEnd ) return 0;

  /* get sign of significand */
  if( *z=='-' ){
    sign = -1;
    z+=incr;
  }else if( *z=='+' ){
    z+=incr;
  }

  /* skip leading zeroes */
  while( z<zEnd && z[0]=='0' ) z+=incr, nDigits++;

  /* copy max significant digits to significand */
  while( z<zEnd && sqlite3Isdigit(*z) && s<((LARGEST_INT64-9)/10) ){
    s = s*10 + (*z - '0');
    z+=incr, nDigits++;
  }

  /* skip non-significant significand digits
  ** (increase exponent by d to shift decimal left) */
  while( z<zEnd && sqlite3Isdigit(*z) ) z+=incr, nDigits++, d++;
  if( z>=zEnd ) goto do_atof_calc;

  /* if decimal point is present */
  if( *z=='.' ){
    z+=incr;
    /* copy digits from after decimal to significand
    ** (decrease exponent by d to shift decimal right) */
    while( z<zEnd && sqlite3Isdigit(*z) && s<((LARGEST_INT64-9)/10) ){
      s = s*10 + (*z - '0');
      z+=incr, nDigits++, d--;
    }
    /* skip non-significant digits */
    while( z<zEnd && sqlite3Isdigit(*z) ) z+=incr, nDigits++;
  }
  if( z>=zEnd ) goto do_atof_calc;

  /* if exponent is present */
  if( *z=='e' || *z=='E' ){
    z+=incr;
    eValid = 0;
    if( z>=zEnd ) goto do_atof_calc;
    /* get sign of exponent */
    if( *z=='-' ){
      esign = -1;
      z+=incr;
    }else if( *z=='+' ){
      z+=incr;
    }
    /* copy digits to exponent */
    while( z<zEnd && sqlite3Isdigit(*z) ){
      e = e<10000 ? (e*10 + (*z - '0')) : 10000;
      z+=incr;
      eValid = 1;
    }
  }

  /* skip trailing spaces */
  if( nDigits && eValid ){
    while( z<zEnd && sqlite3Isspace(*z) ) z+=incr;
  }

do_atof_calc:
  /* adjust exponent by d, and update sign */
  e = (e*esign) + d;
  if( e<0 ) {
    esign = -1;
    e *= -1;
  } else {
    esign = 1;
  }

  /* if 0 significand */
  if( !s ) {
    /* In the IEEE 754 standard, zero is signed.
    ** Add the sign if we've seen at least one digit */
    result = (sign<0 && nDigits) ? -(double)0 : (double)0;
  } else {
    /* attempt to reduce exponent */
    if( esign>0 ){
      while( s<(LARGEST_INT64/10) && e>0 ) e--,s*=10;
    }else{
      while( !(s%10) && e>0 ) e--,s/=10;
    }

    /* adjust the sign of significand */
    s = sign<0 ? -s : s;

    /* if exponent, scale significand as appropriate
    ** and store in result. */
    if( e ){
      LONGDOUBLE_TYPE scale = 1.0;
      /* attempt to handle extremely small/large numbers better */
      if( e>307 && e<342 ){
        while( e%308 ) { scale *= 1.0e+1; e -= 1; }
        if( esign<0 ){
          result = s / scale;
          result /= 1.0e+308;
        }else{
          result = s * scale;
          result *= 1.0e+308;
        }
      }else if( e>=342 ){
        if( esign<0 ){
          result = 0.0*s;
        }else{
          result = 1e308*1e308*s;  /* Infinity */
        }
      }else{
        /* 1.0e+22 is the largest power of 10 than can be 
        ** represented exactly. */
        while( e%22 ) { scale *= 1.0e+1; e -= 1; }
        while( e>0 ) { scale *= 1.0e+22; e -= 22; }
        if( esign<0 ){
          result = s / scale;
        }else{
          result = s * scale;
        }
      }
    } else {
      result = (double)s;
    }
  }

  /* store the result */
  *pResult = result;

  /* return true if number and no extra non-whitespace chracters after */
  return z>=zEnd && nDigits>0 && eValid && nonNum==0;
#else
  return !sqlite3Atoi64(z, pResult, length, enc);
#endif /* SQLITE_OMIT_FLOATING_POINT */
}